

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllRgbWidget.cpp
# Opt level: O2

void __thiscall AllRgbWidget::onResetPixelsRequested(AllRgbWidget *this)

{
  QImage *this_00;
  _Any_data *this_01;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  QImage local_30 [24];
  
  this_01 = &local_58;
  QImage::QImage((QImage *)local_58._M_pod_data,0x1000,0x1000,Format_RGB32);
  this_00 = &this->allRgb_;
  QImage::operator=(this_00,(QImage *)local_58._M_pod_data);
  QImage::~QImage((QImage *)local_58._M_pod_data);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(QImage_&,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/SebastianTroy[P]allRGB/AllRgbWidget.cpp:55:27)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(QImage_&,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/SebastianTroy[P]allRGB/AllRgbWidget.cpp:55:27)>
             ::_M_manager;
  ForEachPixel((AllRgbWidget *)this_01,this_00,(function<void_(QImage_&,_int,_int)> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  QImage::QImage(local_30,(QImage *)this_00);
  onAllRgbUpdated(this,local_30);
  QImage::~QImage(local_30);
  return;
}

Assistant:

void AllRgbWidget::onResetPixelsRequested()
{
    allRgb_ = QImage(4096, 4096, QImage::Format::Format_RGB32);

    ForEachPixel(allRgb_, [](QImage& target, int x, int y)
    {
        target.setPixel(x, y, x + (target.width() * y));
    });

    emit onAllRgbUpdated(allRgb_);
}